

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_test_impossible_marks(REF_SUBDIV ref_subdiv)

{
  REF_CELL ref_cell;
  REF_NODE pRVar1;
  uint uVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  uint cell;
  REF_INT edge;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  REF_DBL RVar16;
  REF_DBL RVar17;
  REF_DBL RVar18;
  REF_BOOL possible;
  REF_INT nodes [27];
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double dStack_128;
  double dStack_120;
  double dStack_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double dStack_c8;
  double dStack_c0;
  REF_BOOL local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  
  ref_cell = ref_subdiv->grid->cell[10];
  if (0 < ref_cell->max) {
    pRVar1 = ref_subdiv->grid->node;
    cell = 0;
    do {
      if (ref_cell->c2n[(long)(int)cell * (long)ref_cell->size_per] != -1) {
        uVar2 = ref_subdiv_map(ref_subdiv,ref_cell,cell);
        uVar3 = ref_cell_nodes(ref_cell,cell,&local_a8);
        if (uVar3 != 0) {
          pcVar15 = "nodes";
          uVar12 = 0x988;
          uVar14 = (ulong)uVar3;
          goto LAB_001efdfc;
        }
        if ((int)uVar2 < 0x82) {
          if (uVar2 == 0) goto LAB_001efdc4;
          if (uVar2 == 0x34) {
            pRVar4 = pRVar1->real;
            lVar6 = (long)local_a8;
            lVar7 = (long)local_a4;
            lVar8 = (long)local_a0;
            lVar9 = (long)local_9c;
            lVar10 = (long)local_98;
            lVar11 = (long)local_94;
            local_148 = pRVar4[lVar6 * 0xf];
            dStack_140 = pRVar4[lVar6 * 0xf + 1];
            local_138 = pRVar4[lVar6 * 0xf + 2];
            dStack_130 = pRVar4[lVar7 * 0xf];
            dStack_128 = pRVar4[lVar7 * 0xf + 1];
            dStack_120 = pRVar4[lVar7 * 0xf + 2];
            dStack_118 = pRVar4[lVar8 * 0xf];
            dStack_110 = pRVar4[lVar8 * 0xf + 1];
            local_108 = pRVar4[lVar8 * 0xf + 2];
            dStack_100 = pRVar4[lVar9 * 0xf] + local_148;
            dStack_f8 = pRVar4[lVar9 * 0xf + 1] + dStack_140;
            dStack_c0 = local_108 + pRVar4[lVar11 * 0xf + 2];
            dStack_f0 = pRVar4[lVar9 * 0xf + 2] + local_138;
            dStack_e8 = pRVar4[lVar10 * 0xf] + dStack_130;
            dStack_e0 = pRVar4[lVar10 * 0xf + 1] + dStack_128;
            local_d8 = pRVar4[lVar10 * 0xf + 2] + dStack_120;
            dStack_d0 = pRVar4[lVar11 * 0xf] + dStack_118;
            dStack_c8 = pRVar4[lVar11 * 0xf + 1] + dStack_110;
LAB_001efb00:
            dStack_c8 = dStack_c8 * 0.5;
            dStack_d0 = dStack_d0 * 0.5;
            local_d8 = local_d8 * 0.5;
            dStack_e0 = dStack_e0 * 0.5;
            dStack_e8 = dStack_e8 * 0.5;
            dStack_f0 = dStack_f0 * 0.5;
            dStack_f8 = dStack_f8 * 0.5;
            dStack_100 = dStack_100 * 0.5;
            dStack_c0 = dStack_c0 * 0.5;
          }
          else {
            if (uVar2 != 0x41) {
LAB_001efe18:
              uVar14 = 0xb;
              uVar5 = 0x800;
              uVar3 = uVar2;
              do {
                iVar13 = (int)uVar14;
                if ((int)uVar5 <= (int)uVar3) {
                  printf("edge %d bit %d\n",uVar14,(ulong)uVar5);
                  uVar3 = uVar3 - uVar5;
                }
                uVar5 = (int)uVar5 / 2;
                uVar14 = (ulong)(iVar13 - 1);
              } while (iVar13 != 0);
              printf("pri %d, map %d\n",(ulong)cell,(ulong)uVar2);
              pcVar15 = "map not implemented yet";
              uVar3 = 6;
              uVar12 = 0x9e1;
              uVar14 = 6;
LAB_001efdfc:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,uVar12,"ref_subdiv_test_impossible_marks",uVar14,pcVar15);
              return uVar3;
            }
            pRVar4 = pRVar1->real;
            lVar6 = (long)local_a8;
            lVar7 = (long)local_a4;
            lVar8 = (long)local_a0;
            lVar9 = (long)local_9c;
            lVar10 = (long)local_98;
            lVar11 = (long)local_94;
            local_148 = pRVar4[lVar6 * 0xf];
            dStack_140 = pRVar4[lVar6 * 0xf + 1];
            local_138 = pRVar4[lVar6 * 0xf + 2];
            dStack_118 = pRVar4[lVar8 * 0xf];
            dStack_110 = pRVar4[lVar8 * 0xf + 1];
            local_108 = pRVar4[lVar8 * 0xf + 2];
            dStack_130 = (pRVar4[lVar7 * 0xf] + local_148) * 0.5;
            dStack_128 = (pRVar4[lVar7 * 0xf + 1] + dStack_140) * 0.5;
            dStack_120 = (local_138 + pRVar4[lVar7 * 0xf + 2]) * 0.5;
            dStack_100 = pRVar4[lVar9 * 0xf];
            dStack_f8 = pRVar4[lVar9 * 0xf + 1];
            dStack_f0 = pRVar4[lVar9 * 0xf + 2];
            dStack_d0 = pRVar4[lVar11 * 0xf];
            dStack_c8 = pRVar4[lVar11 * 0xf + 1];
            dStack_c0 = pRVar4[lVar11 * 0xf + 2];
            dStack_e8 = (pRVar4[lVar10 * 0xf] + dStack_100) * 0.5;
            dStack_e0 = (pRVar4[lVar10 * 0xf + 1] + dStack_f8) * 0.5;
            local_d8 = (dStack_f0 + pRVar4[lVar10 * 0xf + 2]) * 0.5;
          }
        }
        else {
          if (uVar2 == 0x82) {
            pRVar4 = pRVar1->real;
            lVar6 = (long)local_a8;
            lVar7 = (long)local_a4;
            lVar8 = (long)local_a0;
            lVar9 = (long)local_9c;
            lVar10 = (long)local_98;
            local_148 = pRVar4[lVar6 * 0xf];
            dStack_140 = pRVar4[lVar6 * 0xf + 1];
            local_138 = pRVar4[lVar6 * 0xf + 2];
            dStack_130 = pRVar4[lVar7 * 0xf];
            dStack_128 = pRVar4[lVar7 * 0xf + 1];
            dStack_120 = pRVar4[lVar7 * 0xf + 2];
            dStack_118 = pRVar4[lVar8 * 0xf] + local_148;
            dStack_110 = pRVar4[lVar8 * 0xf + 1] + dStack_140;
            local_108 = local_138 + pRVar4[lVar8 * 0xf + 2];
            RVar16 = pRVar4[lVar9 * 0xf];
            RVar17 = pRVar4[lVar9 * 0xf + 1];
            RVar18 = pRVar4[lVar9 * 0xf + 2];
            dStack_e8 = pRVar4[lVar10 * 0xf];
            dStack_e0 = pRVar4[lVar10 * 0xf + 1];
            local_d8 = pRVar4[lVar10 * 0xf + 2];
            dStack_100 = RVar16;
            dStack_f8 = RVar17;
            dStack_f0 = RVar18;
          }
          else {
            if (uVar2 != 0x108) {
              if (uVar2 != 0x1cb) goto LAB_001efe18;
              pRVar4 = pRVar1->real;
              lVar6 = (long)local_a8;
              lVar7 = (long)local_a4;
              lVar8 = (long)local_a0;
              lVar9 = (long)local_9c;
              local_148 = pRVar4[lVar6 * 0xf];
              dStack_140 = pRVar4[lVar6 * 0xf + 1];
              local_138 = pRVar4[lVar6 * 0xf + 2];
              lVar6 = (long)local_98;
              lVar10 = (long)local_94;
              dStack_130 = (pRVar4[lVar7 * 0xf] + local_148) * 0.5;
              dStack_128 = (pRVar4[lVar7 * 0xf + 1] + dStack_140) * 0.5;
              dStack_120 = (pRVar4[lVar7 * 0xf + 2] + local_138) * 0.5;
              dStack_118 = (pRVar4[lVar8 * 0xf] + local_148) * 0.5;
              dStack_110 = (pRVar4[lVar8 * 0xf + 1] + dStack_140) * 0.5;
              local_108 = (pRVar4[lVar8 * 0xf + 2] + local_138) * 0.5;
              dStack_100 = pRVar4[lVar9 * 0xf];
              dStack_f8 = pRVar4[lVar9 * 0xf + 1];
              dStack_f0 = pRVar4[lVar9 * 0xf + 2];
              dStack_e8 = (pRVar4[lVar6 * 0xf] + dStack_100) * 0.5;
              dStack_e0 = (pRVar4[lVar6 * 0xf + 1] + dStack_f8) * 0.5;
              local_d8 = (pRVar4[lVar6 * 0xf + 2] + dStack_f0) * 0.5;
              dStack_d0 = (pRVar4[lVar10 * 0xf] + dStack_100) * 0.5;
              dStack_c8 = (dStack_f8 + pRVar4[lVar10 * 0xf + 1]) * 0.5;
              dStack_c0 = (dStack_f0 + pRVar4[lVar10 * 0xf + 2]) * 0.5;
              ref_subdiv_test_pri((REF_DBL (*) [3])&local_148,&local_ac);
              pRVar4 = pRVar1->real;
              lVar6 = (long)local_a8;
              lVar9 = (long)local_a4;
              lVar10 = (long)local_a0;
              lVar11 = (long)local_9c;
              lVar7 = (long)local_98;
              lVar8 = (long)local_94;
              dStack_130 = pRVar4[lVar9 * 0xf];
              dStack_128 = pRVar4[lVar9 * 0xf + 1];
              dStack_120 = pRVar4[lVar9 * 0xf + 2];
              local_148 = (pRVar4[lVar6 * 0xf] + dStack_130) * 0.5;
              dStack_140 = (pRVar4[lVar6 * 0xf + 1] + dStack_128) * 0.5;
              local_138 = (pRVar4[lVar6 * 0xf + 2] + dStack_120) * 0.5;
              dStack_118 = (pRVar4[lVar10 * 0xf] + dStack_130) * 0.5;
              dStack_110 = (pRVar4[lVar10 * 0xf + 1] + dStack_128) * 0.5;
              dStack_e8 = pRVar4[lVar7 * 0xf];
              dStack_e0 = pRVar4[lVar7 * 0xf + 1];
              local_d8 = pRVar4[lVar7 * 0xf + 2];
              local_108 = (dStack_120 + pRVar4[lVar10 * 0xf + 2]) * 0.5;
              dStack_100 = (dStack_e8 + pRVar4[lVar11 * 0xf]) * 0.5;
              dStack_f8 = (pRVar4[lVar11 * 0xf + 1] + dStack_e0) * 0.5;
              dStack_f0 = (pRVar4[lVar11 * 0xf + 2] + local_d8) * 0.5;
              dStack_d0 = (dStack_e8 + pRVar4[lVar8 * 0xf]) * 0.5;
              dStack_c8 = (dStack_e0 + pRVar4[lVar8 * 0xf + 1]) * 0.5;
              dStack_c0 = (local_d8 + pRVar4[lVar8 * 0xf + 2]) * 0.5;
              ref_subdiv_test_pri((REF_DBL (*) [3])&local_148,&local_ac);
              pRVar4 = pRVar1->real;
              lVar6 = (long)local_a8;
              lVar7 = (long)local_a4;
              lVar8 = (long)local_a0;
              lVar9 = (long)local_9c;
              lVar10 = (long)local_98;
              dStack_118 = pRVar4[lVar8 * 0xf];
              dStack_110 = pRVar4[lVar8 * 0xf + 1];
              local_108 = pRVar4[lVar8 * 0xf + 2];
              lVar8 = (long)local_94;
              local_148 = (dStack_118 + pRVar4[lVar6 * 0xf]) * 0.5;
              dStack_140 = (dStack_110 + pRVar4[lVar6 * 0xf + 1]) * 0.5;
              local_138 = (local_108 + pRVar4[lVar6 * 0xf + 2]) * 0.5;
              dStack_130 = (dStack_118 + pRVar4[lVar7 * 0xf]) * 0.5;
              dStack_128 = (dStack_110 + pRVar4[lVar7 * 0xf + 1]) * 0.5;
              dStack_120 = (local_108 + pRVar4[lVar7 * 0xf + 2]) * 0.5;
              dStack_d0 = pRVar4[lVar8 * 0xf];
              dStack_c8 = pRVar4[lVar8 * 0xf + 1];
              dStack_c0 = pRVar4[lVar8 * 0xf + 2];
              dStack_100 = (dStack_d0 + pRVar4[lVar9 * 0xf]) * 0.5;
              dStack_f8 = (dStack_c8 + pRVar4[lVar9 * 0xf + 1]) * 0.5;
              dStack_f0 = (dStack_c0 + pRVar4[lVar9 * 0xf + 2]) * 0.5;
              dStack_e8 = (dStack_d0 + pRVar4[lVar10 * 0xf]) * 0.5;
              dStack_e0 = (dStack_c8 + pRVar4[lVar10 * 0xf + 1]) * 0.5;
              local_d8 = (dStack_c0 + pRVar4[lVar10 * 0xf + 2]) * 0.5;
              ref_subdiv_test_pri((REF_DBL (*) [3])&local_148,&local_ac);
              pRVar4 = pRVar1->real;
              lVar6 = (long)local_a8;
              lVar7 = (long)local_a4;
              local_148 = (pRVar4[lVar6 * 0xf] + pRVar4[lVar7 * 0xf]) * 0.5;
              dStack_140 = (pRVar4[lVar6 * 0xf + 1] + pRVar4[lVar7 * 0xf + 1]) * 0.5;
              local_138 = (pRVar4[lVar6 * 0xf + 2] + pRVar4[lVar7 * 0xf + 2]) * 0.5;
              lVar8 = (long)local_a0;
              dStack_130 = (pRVar4[lVar7 * 0xf] + pRVar4[lVar8 * 0xf]) * 0.5;
              dStack_128 = (pRVar4[lVar7 * 0xf + 1] + pRVar4[lVar8 * 0xf + 1]) * 0.5;
              dStack_120 = (pRVar4[lVar7 * 0xf + 2] + pRVar4[lVar8 * 0xf + 2]) * 0.5;
              dStack_118 = (pRVar4[lVar8 * 0xf] + pRVar4[lVar6 * 0xf]) * 0.5;
              dStack_110 = (pRVar4[lVar8 * 0xf + 1] + pRVar4[lVar6 * 0xf + 1]) * 0.5;
              local_108 = (pRVar4[lVar8 * 0xf + 2] + pRVar4[lVar6 * 0xf + 2]) * 0.5;
              lVar6 = (long)local_9c;
              lVar7 = (long)local_98;
              dStack_100 = pRVar4[lVar6 * 0xf] + pRVar4[lVar7 * 0xf];
              dStack_f8 = pRVar4[lVar6 * 0xf + 1] + pRVar4[lVar7 * 0xf + 1];
              dStack_f0 = pRVar4[lVar6 * 0xf + 2] + pRVar4[lVar7 * 0xf + 2];
              lVar8 = (long)local_94;
              dStack_e8 = pRVar4[lVar7 * 0xf] + pRVar4[lVar8 * 0xf];
              pRVar4 = pRVar1->real;
              dStack_e0 = pRVar4[lVar7 * 0xf + 1] + pRVar4[lVar8 * 0xf + 1];
              local_d8 = pRVar4[lVar7 * 0xf + 2] + pRVar4[lVar8 * 0xf + 2];
              lVar6 = (long)local_a8;
              dStack_d0 = pRVar4[lVar8 * 0xf] + pRVar4[lVar6 * 0xf];
              dStack_c8 = pRVar4[lVar8 * 0xf + 1] + pRVar4[lVar6 * 0xf + 1];
              dStack_c0 = pRVar4[lVar8 * 0xf + 2] + pRVar4[lVar6 * 0xf + 2];
              goto LAB_001efb00;
            }
            pRVar4 = pRVar1->real;
            lVar6 = (long)local_a8;
            lVar7 = (long)local_a4;
            lVar8 = (long)local_a0;
            lVar9 = (long)local_9c;
            lVar10 = (long)local_98;
            local_148 = pRVar4[lVar6 * 0xf];
            dStack_140 = pRVar4[lVar6 * 0xf + 1];
            local_138 = pRVar4[lVar6 * 0xf + 2];
            dStack_130 = pRVar4[lVar7 * 0xf];
            dStack_128 = pRVar4[lVar7 * 0xf + 1];
            dStack_120 = pRVar4[lVar7 * 0xf + 2];
            dStack_118 = pRVar4[lVar8 * 0xf] + dStack_130;
            dStack_110 = pRVar4[lVar8 * 0xf + 1] + dStack_128;
            local_108 = dStack_120 + pRVar4[lVar8 * 0xf + 2];
            RVar16 = pRVar4[lVar10 * 0xf];
            RVar17 = pRVar4[lVar10 * 0xf + 1];
            RVar18 = pRVar4[lVar10 * 0xf + 2];
            dStack_100 = pRVar4[lVar9 * 0xf];
            dStack_f8 = pRVar4[lVar9 * 0xf + 1];
            dStack_f0 = pRVar4[lVar9 * 0xf + 2];
            dStack_e8 = RVar16;
            dStack_e0 = RVar17;
            local_d8 = RVar18;
          }
          lVar6 = (long)local_94;
          dStack_110 = dStack_110 * 0.5;
          dStack_118 = dStack_118 * 0.5;
          local_108 = local_108 * 0.5;
          dStack_d0 = (pRVar4[lVar6 * 0xf] + RVar16) * 0.5;
          dStack_c8 = (pRVar4[lVar6 * 0xf + 1] + RVar17) * 0.5;
          dStack_c0 = (RVar18 + pRVar4[lVar6 * 0xf + 2]) * 0.5;
        }
        ref_subdiv_test_pri((REF_DBL (*) [3])&local_148,&local_ac);
      }
LAB_001efdc4:
      cell = cell + 1;
    } while ((int)cell < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_test_impossible_marks(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz[6][3];
  REF_INT map;
  REF_BOOL possible;
  ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));

  ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));

  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 52: /* prism split top and bottom, edges 2,4,5 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 3);
        replace_xyz0_avg(xyz, 1, 4);
        replace_xyz0_avg(xyz, 2, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 3, 0);
        replace_xyz0_avg(xyz, 4, 1);
        replace_xyz0_avg(xyz, 5, 2);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 65: /* prism split edges 0, 6 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 1);
        replace_xyz0_avg(xyz, 3, 4);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 0);
        replace_xyz0_avg(xyz, 4, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 130: /* prism split edges 1, 7 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 2);
        replace_xyz0_avg(xyz, 3, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 2, 0);
        replace_xyz0_avg(xyz, 5, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 264: /* prism split edges 3, 8 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 2);
        replace_xyz0_avg(xyz, 4, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 2, 1);
        replace_xyz0_avg(xyz, 5, 4);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 459: /* prism split */
        /* near edge 0-3 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 0);
        replace_xyz0_avg(xyz, 2, 0);
        replace_xyz0_avg(xyz, 4, 3);
        replace_xyz0_avg(xyz, 5, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* near edge 1-4 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 1);
        replace_xyz0_avg(xyz, 2, 1);
        replace_xyz0_avg(xyz, 3, 4);
        replace_xyz0_avg(xyz, 5, 4);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* near edge 2-5 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 2);
        replace_xyz0_avg(xyz, 1, 2);
        replace_xyz0_avg(xyz, 3, 5);
        replace_xyz0_avg(xyz, 4, 5);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* center */
        fill_xyz_avg(xyz, 0, 0, 1);
        fill_xyz_avg(xyz, 1, 1, 2);
        fill_xyz_avg(xyz, 2, 2, 0);

        fill_xyz_avg(xyz, 3, 3, 4);
        fill_xyz_avg(xyz, 4, 4, 5);
        fill_xyz_avg(xyz, 5, 5, 0);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pri %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  return REF_SUCCESS;
}